

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical
          (ChLoadXYZROTnodeXYZROTnodeBushingSpherical *this,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping)

{
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &mnodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZROTnodeXYZROTnode::ChLoadXYZROTnodeXYZROTnode
            (&this->super_ChLoadXYZROTnodeXYZROTnode,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_50,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_40,abs_application);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_ChLoadXYZROTnodeXYZROTnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeXYZROTnode_01176f48;
  (this->stiffness).m_data[0] = mstiffness->m_data[0];
  (this->stiffness).m_data[1] = mstiffness->m_data[1];
  (this->stiffness).m_data[2] = mstiffness->m_data[2];
  (this->damping).m_data[0] = mdamping->m_data[0];
  (this->damping).m_data[1] = mdamping->m_data[1];
  (this->damping).m_data[2] = mdamping->m_data[2];
  return;
}

Assistant:

ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical(
    std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
    std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
    const ChFrame<>& abs_application,  ///< bushing location, in abs. coordinates. Will define loc_application_A and
                                       ///< loc_application_B
    const ChVector<>& mstiffness,      ///< stiffness, along x y z axes of the abs_application
    const ChVector<>& mdamping         ///< damping, along x y z axes of the abs_application
    )
    : ChLoadXYZROTnodeXYZROTnode(mnodeA, mnodeB, abs_application), stiffness(mstiffness), damping(mdamping) {}